

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O3

bool Is8KSectorTrack(Track *track)

{
  bool bVar1;
  int iVar2;
  Sector *this;
  
  iVar2 = Track::size(track);
  if (iVar2 == 1) {
    this = Track::operator[](track,0);
    if (this->datarate != _250K) {
      return false;
    }
    if (this->encoding != MFM) {
      return false;
    }
    iVar2 = Sector::size(this);
    if ((iVar2 == 0x2000) && (bVar1 = Sector::has_data(this), bVar1)) {
      if (opt.debug == 0) {
        return true;
      }
      util::operator<<((LogHelper *)&util::cout,(char (*) [26])"detected 8K sector track\n");
      return true;
    }
  }
  return false;
}

Assistant:

bool Is8KSectorTrack(const Track& track)
{
    // There must only be 1 sector.
    if (track.size() != 1)
        return false;

    auto& sector{ track[0] };
    if (sector.datarate != DataRate::_250K || sector.encoding != Encoding::MFM ||
        sector.size() != 8192 || !sector.has_data())
        return false;

    if (opt.debug) util::cout << "detected 8K sector track\n";
    return true;
}